

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O1

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::AddSwitchForAccessChain
          (ReplaceDescArrayAccessUsingVarIndex *this,BasicBlock *parent_block,
          uint32_t access_chain_index_var_id,uint32_t default_id,uint32_t merge_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *case_block_ids)

{
  pointer puVar1;
  ulong uVar2;
  long lVar3;
  vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
  cases;
  InstructionBuilder builder;
  undefined1 local_90 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_70;
  vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
  local_68;
  InstructionBuilder local_50;
  
  local_50.context_ = (this->super_Pass).context_;
  local_50.preserved_analyses_ =
       (uint)(anonymous_namespace)::kAnalysisDefUseAndInstrToBlockMapping * 3;
  local_50.insert_before_.super_iterator.node_ =
       (iterator)&(parent_block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  local_68.
  super__Vector_base<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (case_block_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
           .super__Vector_impl_data._M_start;
  local_50.parent_ = parent_block;
  if ((int)((ulong)((long)(case_block_ids->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar1) >> 2) != 0) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      local_90._0_8_ = &PTR__SmallVector_003e9b28;
      local_90._24_8_ = local_90 + 0x10;
      local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_90._16_4_ = (undefined4)uVar2;
      local_90._8_8_ = 1;
      std::
      vector<std::pair<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int>,std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int>>>
      ::emplace_back<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int_const&>
                ((vector<std::pair<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int>,std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int>>>
                  *)&local_68,(SmallVector<unsigned_int,_2UL> *)local_90,
                 (uint *)((long)puVar1 + lVar3));
      local_90._0_8_ = &PTR__SmallVector_003e9b28;
      if (local_70._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_70,local_70._M_head_impl);
      }
      uVar2 = uVar2 + 1;
      puVar1 = (case_block_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 4;
    } while (uVar2 < ((ulong)((long)(case_block_ids->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 2
                     & 0xffffffff));
  }
  InstructionBuilder::AddSwitch(&local_50,access_chain_index_var_id,default_id,&local_68,merge_id,0)
  ;
  std::
  vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::AddSwitchForAccessChain(
    BasicBlock* parent_block, uint32_t access_chain_index_var_id,
    uint32_t default_id, uint32_t merge_id,
    const std::vector<uint32_t>& case_block_ids) const {
  InstructionBuilder builder{context(), parent_block,
                             kAnalysisDefUseAndInstrToBlockMapping};
  std::vector<std::pair<Operand::OperandData, uint32_t>> cases;
  for (uint32_t i = 0; i < static_cast<uint32_t>(case_block_ids.size()); ++i) {
    cases.emplace_back(Operand::OperandData{i}, case_block_ids[i]);
  }
  builder.AddSwitch(access_chain_index_var_id, default_id, cases, merge_id);
}